

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_redaction.pb.cc
# Opt level: O0

size_t __thiscall proto2_unittest::TestMessageEnum::ByteSizeLong(TestMessageEnum *this)

{
  int size;
  RepeatedField<int> *value;
  size_t sVar1;
  size_t sVar2;
  size_t tag_size;
  size_t data_size;
  uint32_t cached_has_bits;
  size_t total_size;
  TestMessageEnum *this_;
  TestMessageEnum *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  value = _internal_redactable_enum(this);
  sVar1 = google::protobuf::internal::WireFormatLite::EnumSize(value);
  size = _internal_redactable_enum_size(this);
  sVar2 = google::protobuf::internal::FromIntSize(size);
  sVar1 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar1 + sVar2,&(this->field_0)._impl_._cached_size_);
  return sVar1;
}

Assistant:

::size_t TestMessageEnum::ByteSizeLong() const {
  const TestMessageEnum& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_unittest.TestMessageEnum)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .proto2_unittest.MetaAnnotatedEnum redactable_enum = 1;
    {
      ::size_t data_size =
          ::_pbi::WireFormatLite::EnumSize(this_._internal_redactable_enum());
      ::size_t tag_size = ::size_t{1} *
          ::_pbi::FromIntSize(this_._internal_redactable_enum_size());
      total_size += data_size + tag_size;
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}